

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_helpers.cc
# Opt level: O0

char * google::protobuf::compiler::cxx::PrimitiveTypeName(CppType type)

{
  LogMessage *other;
  LogFinisher local_5d [13];
  LogMessage local_50;
  CppType local_14;
  char *pcStack_10;
  CppType type_local;
  
  switch(type) {
  case CPPTYPE_INT32:
    pcStack_10 = "::google::protobuf::int32";
    break;
  case CPPTYPE_INT64:
    pcStack_10 = "::google::protobuf::int64";
    break;
  case CPPTYPE_UINT32:
    pcStack_10 = "::google::protobuf::uint32";
    break;
  case CPPTYPE_UINT64:
    pcStack_10 = "::google::protobuf::uint64";
    break;
  case CPPTYPE_DOUBLE:
    pcStack_10 = "double";
    break;
  case CPPTYPE_FLOAT:
    pcStack_10 = "float";
    break;
  case CPPTYPE_BOOL:
    pcStack_10 = "bool";
    break;
  case CPPTYPE_ENUM:
    pcStack_10 = "int";
    break;
  case CPPTYPE_STRING:
    pcStack_10 = "::std::string";
    break;
  case CPPTYPE_MESSAGE:
    pcStack_10 = (char *)0x0;
    break;
  default:
    local_14 = type;
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/cxx25x/cxx_helpers.cc"
               ,0xe1);
    other = internal::LogMessage::operator<<(&local_50,"Can\'t get here.");
    internal::LogFinisher::operator=(local_5d,other);
    internal::LogMessage::~LogMessage(&local_50);
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

const char* PrimitiveTypeName(FieldDescriptor::CppType type) {
  switch (type) {
    case FieldDescriptor::CPPTYPE_INT32  : return "::google::protobuf::int32";
    case FieldDescriptor::CPPTYPE_INT64  : return "::google::protobuf::int64";
    case FieldDescriptor::CPPTYPE_UINT32 : return "::google::protobuf::uint32";
    case FieldDescriptor::CPPTYPE_UINT64 : return "::google::protobuf::uint64";
    case FieldDescriptor::CPPTYPE_DOUBLE : return "double";
    case FieldDescriptor::CPPTYPE_FLOAT  : return "float";
    case FieldDescriptor::CPPTYPE_BOOL   : return "bool";
    case FieldDescriptor::CPPTYPE_ENUM   : return "int";
    case FieldDescriptor::CPPTYPE_STRING : return "::std::string";
    case FieldDescriptor::CPPTYPE_MESSAGE: return NULL;

    // No default because we want the compiler to complain if any new
    // CxxTypes are added.
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return NULL;
}